

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O3

int Fl_Text_Editor::kf_undo(int param_1,Fl_Text_Editor *e)

{
  uint *puVar1;
  int iVar2;
  int crsr;
  int local_1c;
  
  Fl_Text_Buffer::unselect((e->super_Fl_Text_Display).mBuffer);
  Fl::copy((Fl *)0x213172,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)0x0);
  iVar2 = Fl_Text_Buffer::undo((e->super_Fl_Text_Display).mBuffer,&local_1c);
  Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,local_1c);
  Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  puVar1 = &(e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.when_ & 1) != 0) {
    Fl_Widget::do_callback
              ((Fl_Widget *)e,(Fl_Widget *)e,
               (e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.user_data_);
  }
  return iVar2;
}

Assistant:

int Fl_Text_Editor::kf_undo(int , Fl_Text_Editor* e) {
  e->buffer()->unselect();
  Fl::copy("", 0, 0);
  int crsr;
  int ret = e->buffer()->undo(&crsr);
  e->insert_position(crsr);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return ret;
}